

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<char,int>
          (string *__return_storage_ptr__,internal *this,char *value,int *param_2)

{
  int *param_1_local;
  char *value_local;
  
  PrintToString<char>(__return_storage_ptr__,(char *)this);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}